

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O2

String * doctest::toString(String *__return_storage_ptr__,Approx *in)

{
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  String::String(&local_40,"Approx( ");
  detail::toStreamLit<double>(&local_58,in->m_value);
  operator+(&local_28,&local_40,&local_58);
  String::String(&local_70," )");
  operator+(__return_storage_ptr__,&local_28,&local_70);
  String::~String(&local_70);
  String::~String(&local_28);
  String::~String(&local_58);
  String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String toString(const Approx& in) {
    return "Approx( " + doctest::toString(in.m_value) + " )";
}